

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O2

void __thiscall logging_tests::logging_LogPrintMacros::test_method(logging_LogPrintMacros *this)

{
  long lVar1;
  bool bVar2;
  istream *piVar3;
  iterator pvVar4;
  iterator pvVar5;
  long lVar6;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  const_string file_00;
  const_string msg;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  Level in_stack_fffffffffffffcb8;
  char *in_stack_fffffffffffffcc0;
  char (*in_stack_fffffffffffffcc8) [6];
  assertion_result local_330;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  allocator_type local_2f4;
  allocator<char> local_2f3;
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  log_lines;
  string log;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  ifstream file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::LogAcceptCategory(NET,Trace);
  if (bVar2) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp"
    ;
    source_file._M_len = 0x5f;
    logging_function._M_str = "test_method";
    logging_function._M_len = 0xb;
    LogPrintf_<char[5]>(logging_function,source_file,0x88,NET,Trace,"foo6: %s\n",
                        (char (*) [5])0xbb2c06);
  }
  bVar2 = ::LogAcceptCategory(NET,Debug);
  if (bVar2) {
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp"
    ;
    source_file_00._M_len = 0x5f;
    logging_function_00._M_str = "test_method";
    logging_function_00._M_len = 0xb;
    LogPrintf_<char[5]>(logging_function_00,source_file_00,0x89,NET,Debug,"foo7: %s\n",
                        (char (*) [5])0xbb2ec3);
  }
  pvVar5 = (iterator)0xffffffffffffffff;
  source_file_01._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp"
  ;
  source_file_01._M_len = 0x5f;
  logging_function_01._M_str = "test_method";
  logging_function_01._M_len = 0xb;
  LogPrintf_<char[5]>(logging_function_01,source_file_01,0x8a,ALL,Info,"foo8: %s\n",
                      (char (*) [5])0xbb2c99);
  source_file_02._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp"
  ;
  source_file_02._M_len = 0x5f;
  logging_function_02._M_str = "test_method";
  logging_function_02._M_len = 0xb;
  LogPrintf_<char[5]>(logging_function_02,source_file_02,0x8b,ALL,Warning,"foo9: %s\n",
                      (char (*) [5])0xbb2cb2);
  pvVar4 = (iterator)0x8c;
  source_file_03._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp"
  ;
  source_file_03._M_len = 0x5f;
  logging_function_03._M_str = "test_method";
  logging_function_03._M_len = 0xb;
  LogPrintf_<char[6]>(logging_function_03,source_file_03,0x8c,ALL,in_stack_fffffffffffffcb8,
                      in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8);
  std::ifstream::ifstream<fs::path,fs::path>
            ((ifstream *)&file,&(this->super_LogSetup).tmp_log_path,_S_in);
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  log._M_dataplus._M_p = (pointer)&log.field_2;
  log._M_string_length = 0;
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  log.field_2._M_allocated_capacity = log.field_2._M_allocated_capacity & 0xffffffffffffff00;
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&file,(string *)&log);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&log_lines,&log);
  }
  std::__cxx11::string::~string((string *)&log);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log,"[net] foo7: bar7",(allocator<char> *)&local_330);
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"foo8: bar8",&local_2f1);
  std::__cxx11::string::string<std::allocator<char>>(local_280,"[warning] foo9: bar9",&local_2f2);
  std::__cxx11::string::string<std::allocator<char>>(local_260,"[error] foo10: bar10",&local_2f3);
  __l._M_len = 4;
  __l._M_array = &log;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expected,__l,&local_2f4);
  lVar6 = 0x60;
  do {
    std::__cxx11::string::~string(local_2a0 + lVar6 + -0x20);
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x98;
  file_00.m_begin = (iterator)&local_308;
  msg.m_end = pvVar5;
  msg.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_318,msg);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_330,(equal_coll_impl *)&local_2f1,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )log_lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )log_lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  log._M_string_length = log._M_string_length & 0xffffffffffffff00;
  log._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011480b0;
  log.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  log.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  boost::test_tools::tt_detail::report_assertion
            (&local_330,(lazy_ostream *)&log,1,0xd,4,0xbb2c0b,(size_t)&stack0xfffffffffffffcc0,0x98,
             "log_lines.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_330.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expected);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&log_lines);
  std::ifstream::~ifstream(&file);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(logging_LogPrintMacros, LogSetup)
{
    LogTrace(BCLog::NET, "foo6: %s\n", "bar6"); // not logged
    LogDebug(BCLog::NET, "foo7: %s\n", "bar7");
    LogInfo("foo8: %s\n", "bar8");
    LogWarning("foo9: %s\n", "bar9");
    LogError("foo10: %s\n", "bar10");
    std::ifstream file{tmp_log_path};
    std::vector<std::string> log_lines;
    for (std::string log; std::getline(file, log);) {
        log_lines.push_back(log);
    }
    std::vector<std::string> expected = {
        "[net] foo7: bar7",
        "foo8: bar8",
        "[warning] foo9: bar9",
        "[error] foo10: bar10",
    };
    BOOST_CHECK_EQUAL_COLLECTIONS(log_lines.begin(), log_lines.end(), expected.begin(), expected.end());
}